

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O3

char __thiscall FIX::CharField::getValue(CharField *this)

{
  char cVar1;
  
  cVar1 = CharConvertor::convert(&(this->super_FieldBase).m_string);
  return cVar1;
}

Assistant:

EXCEPT(IncorrectDataFormat) {
    try {
      return CharConvertor::convert(getString());
    } catch (FieldConvertError &) {
      throw IncorrectDataFormat(getTag(), getString());
    }
  }